

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBarsH<long_long>
               (char *label_id,longlong *xs,longlong *ys,int count,double height,int offset,
               int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<long_long> getter;
  int stride_local;
  int offset_local;
  double height_local;
  int count_local;
  longlong *ys_local;
  longlong *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<long_long>::GetterXsYs((GetterXsYs<long_long> *)local_58,xs,ys,count,offset,stride);
  PlotBarsHEx<ImPlot::GetterXsYs<long_long>,double>
            (label_id,(GetterXsYs<long_long> *)local_58,height);
  return;
}

Assistant:

void PlotBarsH(const char* label_id, const T* xs, const T* ys, int count, double height, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsHEx(label_id, getter, height);
}